

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

bool google::protobuf::internal::WireFormat::ParseAndMergeField
               (uint32_t tag,FieldDescriptor *field,Message *message,CodedInputStream *input)

{
  char cVar1;
  bool bVar2;
  Type TVar3;
  Limit limit;
  int iVar4;
  UnknownFieldSet *pUVar5;
  Message *pMVar6;
  undefined4 extraout_var;
  EnumDescriptor *this;
  EnumValueDescriptor *value_00;
  Reflection *this_00;
  uint64_t value_01;
  string *value_02;
  double value;
  uint32_t length;
  string local_d8;
  Limit local_b8;
  uint32_t local_b4;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  if (field == (FieldDescriptor *)0x0) {
LAB_003b67b5:
    pUVar5 = Reflection::MutableUnknownFields(this_00,message);
    bVar2 = SkipField(input,tag,pUVar5);
    return bVar2;
  }
  TVar3 = FieldDescriptor::type(field);
  if ((tag & 7) != *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)TVar3 * 4)) {
    bVar2 = FieldDescriptor::is_packable(field);
    if ((tag & 7) == 2 && bVar2) {
      bVar2 = io::CodedInputStream::ReadVarint32(input,&local_b4);
      if (!bVar2) {
        return false;
      }
      limit = io::CodedInputStream::PushLimit(input,local_b4);
      TVar3 = FieldDescriptor::type(field);
      switch(TVar3) {
      case TYPE_DOUBLE:
        while (iVar4 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar4) {
          bVar2 = WireFormatLite::
                  ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                            (input,(double *)&local_d8);
          if (!bVar2) {
            return false;
          }
          Reflection::AddDouble(this_00,message,field,(double)local_d8._M_dataplus._M_p);
        }
        break;
      case TYPE_FLOAT:
        while (iVar4 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar4) {
          bVar2 = WireFormatLite::
                  ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                            (input,(float *)&local_d8);
          if (!bVar2) {
            return false;
          }
          Reflection::AddFloat(this_00,message,field,local_d8._M_dataplus._M_p._0_4_);
        }
        break;
      case TYPE_INT64:
        while (iVar4 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar4) {
          bVar2 = WireFormatLite::
                  ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                            (input,(int64_t *)&local_d8);
          if (!bVar2) {
            return false;
          }
          Reflection::AddInt64(this_00,message,field,(int64_t)local_d8._M_dataplus._M_p);
        }
        break;
      case TYPE_UINT64:
        while (iVar4 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar4) {
          bVar2 = io::CodedInputStream::ReadVarint64(input,(uint64_t *)&local_d8);
          if (!bVar2) {
            return false;
          }
          Reflection::AddUInt64(this_00,message,field,(uint64_t)local_d8._M_dataplus._M_p);
        }
        break;
      case TYPE_INT32:
        while (iVar4 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar4) {
          bVar2 = WireFormatLite::
                  ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                            (input,(int32_t *)&local_d8);
          if (!bVar2) {
            return false;
          }
          Reflection::AddInt32(this_00,message,field,(int32_t)local_d8._M_dataplus._M_p._0_4_);
        }
        break;
      case TYPE_FIXED64:
        while (iVar4 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar4) {
          bVar2 = io::CodedInputStream::ReadLittleEndian64(input,(uint64_t *)&local_d8);
          if (!bVar2) {
            return false;
          }
          Reflection::AddUInt64(this_00,message,field,(uint64_t)local_d8._M_dataplus._M_p);
        }
        break;
      case TYPE_FIXED32:
        while (iVar4 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar4) {
          bVar2 = io::CodedInputStream::ReadLittleEndian32(input,(uint32_t *)&local_d8);
          if (!bVar2) {
            return false;
          }
          Reflection::AddUInt32(this_00,message,field,(uint32_t)local_d8._M_dataplus._M_p._0_4_);
        }
        break;
      case TYPE_BOOL:
        while (iVar4 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar4) {
          bVar2 = WireFormatLite::
                  ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                            (input,(bool *)&local_d8);
          if (!bVar2) {
            return false;
          }
          Reflection::AddBool(this_00,message,field,local_d8._M_dataplus._M_p._0_1_);
        }
        break;
      case TYPE_STRING:
      case TYPE_GROUP:
      case TYPE_MESSAGE:
      case TYPE_BYTES:
        return false;
      case TYPE_UINT32:
        while (iVar4 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar4) {
          bVar2 = io::CodedInputStream::ReadVarint32(input,(uint32_t *)&local_d8);
          if (!bVar2) {
            return false;
          }
          Reflection::AddUInt32(this_00,message,field,(uint32_t)local_d8._M_dataplus._M_p._0_4_);
        }
        break;
      case TYPE_ENUM:
        local_b8 = limit;
        while (iVar4 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar4) {
          bVar2 = WireFormatLite::
                  ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                            (input,(int *)&local_d8);
          if (!bVar2) {
            return false;
          }
          iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
          if (*(char *)(*(long *)(CONCAT44(extraout_var,iVar4) + 0x10) + 0x3a) == '\x03') {
            Reflection::AddEnumValue(this_00,message,field,(int)local_d8._M_dataplus._M_p._0_4_);
          }
          else {
            this = FieldDescriptor::enum_type(field);
            value_00 = EnumDescriptor::FindValueByNumber(this,(int)local_d8._M_dataplus._M_p._0_4_);
            if (value_00 == (EnumValueDescriptor *)0x0) {
              value_01 = (uint64_t)(int)local_d8._M_dataplus._M_p._0_4_;
              pUVar5 = Reflection::MutableUnknownFields(this_00,message);
              limit = local_b8;
              UnknownFieldSet::AddVarint(pUVar5,tag >> 3,value_01);
            }
            else {
              Reflection::AddEnum(this_00,message,field,value_00);
            }
          }
        }
        break;
      case TYPE_SFIXED32:
        while (iVar4 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar4) {
          bVar2 = WireFormatLite::
                  ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)15>
                            (input,(int32_t *)&local_d8);
          if (!bVar2) {
            return false;
          }
          Reflection::AddInt32(this_00,message,field,(int32_t)local_d8._M_dataplus._M_p._0_4_);
        }
        break;
      case TYPE_SFIXED64:
        while (iVar4 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar4) {
          bVar2 = WireFormatLite::
                  ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)16>
                            (input,(int64_t *)&local_d8);
          if (!bVar2) {
            return false;
          }
          Reflection::AddInt64(this_00,message,field,(int64_t)local_d8._M_dataplus._M_p);
        }
        break;
      case TYPE_SINT32:
        while (iVar4 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar4) {
          bVar2 = WireFormatLite::
                  ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
                            (input,(int32_t *)&local_d8);
          if (!bVar2) {
            return false;
          }
          Reflection::AddInt32(this_00,message,field,(int32_t)local_d8._M_dataplus._M_p._0_4_);
        }
        break;
      case MAX_TYPE:
        while (iVar4 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar4) {
          bVar2 = WireFormatLite::
                  ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)18>
                            (input,(int64_t *)&local_d8);
          if (!bVar2) {
            return false;
          }
          Reflection::AddInt64(this_00,message,field,(int64_t)local_d8._M_dataplus._M_p);
        }
      }
      io::CodedInputStream::PopLimit(input,limit);
      return true;
    }
    goto LAB_003b67b5;
  }
  TVar3 = FieldDescriptor::type(field);
  switch(TVar3) {
  case TYPE_DOUBLE:
    bVar2 = WireFormatLite::
            ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                      (input,(double *)&local_d8);
    if (!bVar2) {
      return false;
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddDouble(this_00,message,field,(double)local_d8._M_dataplus._M_p);
    }
    else {
      Reflection::SetDouble(this_00,message,field,(double)local_d8._M_dataplus._M_p);
    }
    break;
  case TYPE_FLOAT:
    bVar2 = WireFormatLite::
            ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                      (input,(float *)&local_d8);
    if (!bVar2) {
      return false;
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddFloat(this_00,message,field,local_d8._M_dataplus._M_p._0_4_);
    }
    else {
      Reflection::SetFloat(this_00,message,field,local_d8._M_dataplus._M_p._0_4_);
    }
    break;
  case TYPE_INT64:
    bVar2 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                      (input,(int64_t *)&local_d8);
    goto LAB_003b6968;
  case TYPE_UINT64:
    bVar2 = io::CodedInputStream::ReadVarint64(input,(uint64_t *)&local_d8);
    goto LAB_003b699f;
  case TYPE_INT32:
    bVar2 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                      (input,(int32_t *)&local_d8);
    goto LAB_003b685b;
  case TYPE_FIXED64:
    bVar2 = io::CodedInputStream::ReadLittleEndian64(input,(uint64_t *)&local_d8);
LAB_003b699f:
    if (bVar2 == false) {
      return false;
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddUInt64(this_00,message,field,(uint64_t)local_d8._M_dataplus._M_p);
      return true;
    }
    Reflection::SetUInt64(this_00,message,field,(uint64_t)local_d8._M_dataplus._M_p);
    return true;
  case TYPE_FIXED32:
    bVar2 = io::CodedInputStream::ReadLittleEndian32(input,(uint32_t *)&local_d8);
    goto LAB_003b6a0c;
  case TYPE_BOOL:
    bVar2 = WireFormatLite::
            ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                      (input,(bool *)&local_d8);
    if (!bVar2) {
      return false;
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddBool(this_00,message,field,local_d8._M_dataplus._M_p._0_1_);
    }
    else {
      Reflection::SetBool(this_00,message,field,local_d8._M_dataplus._M_p._0_1_);
    }
    break;
  case TYPE_STRING:
    cVar1 = *(char *)(*(long *)(field + 0x10) + 0x3a);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    bVar2 = WireFormatLite::ReadBytes(input,&local_d8);
    if (!bVar2) {
LAB_003b6aad:
      std::__cxx11::string::~string((string *)&local_d8);
      return false;
    }
    if (cVar1 == '\x03') {
      bVar2 = WireFormatLite::VerifyUtf8String
                        (local_d8._M_dataplus._M_p,(int)local_d8._M_string_length,PARSE,
                         *(char **)(*(long *)(field + 8) + 0x20));
      if (!bVar2) goto LAB_003b6aad;
    }
    else {
      WireFormatLite::VerifyUtf8String
                (local_d8._M_dataplus._M_p,(int)local_d8._M_string_length,PARSE,
                 *(char **)(*(long *)(field + 8) + 0x20));
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      value_02 = &local_50;
      std::__cxx11::string::string((string *)value_02,(string *)&local_d8);
      Reflection::AddString(this_00,message,field,value_02);
    }
    else {
      value_02 = &local_70;
      std::__cxx11::string::string((string *)value_02,(string *)&local_d8);
      Reflection::SetString(this_00,message,field,value_02);
    }
    goto LAB_003b6f1d;
  case TYPE_GROUP:
    if ((~(byte)field[1] & 0x60) == 0) {
      pMVar6 = Reflection::AddMessage(this_00,message,field,input->extension_factory_);
    }
    else {
      pMVar6 = Reflection::MutableMessage(this_00,message,field,input->extension_factory_);
    }
    bVar2 = WireFormatLite::ReadGroup<google::protobuf::Message>(tag >> 3,input,pMVar6);
    goto LAB_003b6b08;
  case TYPE_MESSAGE:
    if ((~(byte)field[1] & 0x60) == 0) {
      pMVar6 = Reflection::AddMessage(this_00,message,field,input->extension_factory_);
    }
    else {
      pMVar6 = Reflection::MutableMessage(this_00,message,field,input->extension_factory_);
    }
    bVar2 = WireFormatLite::ReadMessage<google::protobuf::Message>(input,pMVar6);
LAB_003b6b08:
    if (bVar2 == false) {
      return false;
    }
    return true;
  case TYPE_BYTES:
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    bVar2 = WireFormatLite::ReadBytes(input,&local_d8);
    if (!bVar2) goto LAB_003b6aad;
    if ((~(byte)field[1] & 0x60) == 0) {
      value_02 = &local_90;
      std::__cxx11::string::string((string *)value_02,(string *)&local_d8);
      Reflection::AddString(this_00,message,field,value_02);
    }
    else {
      value_02 = &local_b0;
      std::__cxx11::string::string((string *)value_02,(string *)&local_d8);
      Reflection::SetString(this_00,message,field,value_02);
    }
LAB_003b6f1d:
    std::__cxx11::string::~string((string *)value_02);
    std::__cxx11::string::~string((string *)&local_d8);
    break;
  case TYPE_UINT32:
    bVar2 = io::CodedInputStream::ReadVarint32(input,(uint32_t *)&local_d8);
LAB_003b6a0c:
    if (bVar2 == false) {
      return false;
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddUInt32(this_00,message,field,(uint32_t)local_d8._M_dataplus._M_p._0_4_);
      return true;
    }
    Reflection::SetUInt32(this_00,message,field,(uint32_t)local_d8._M_dataplus._M_p._0_4_);
    return true;
  case TYPE_ENUM:
    bVar2 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                      (input,(int *)&local_d8);
    if (!bVar2) {
      return false;
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddEnumValue(this_00,message,field,(int)local_d8._M_dataplus._M_p._0_4_);
    }
    else {
      Reflection::SetEnumValue(this_00,message,field,(int)local_d8._M_dataplus._M_p._0_4_);
    }
    break;
  case TYPE_SFIXED32:
    bVar2 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)15>
                      (input,(int32_t *)&local_d8);
    goto LAB_003b685b;
  case TYPE_SFIXED64:
    bVar2 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)16>
                      (input,(int64_t *)&local_d8);
    goto LAB_003b6968;
  case TYPE_SINT32:
    bVar2 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
                      (input,(int32_t *)&local_d8);
LAB_003b685b:
    if (bVar2 == false) {
      return false;
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddInt32(this_00,message,field,(int32_t)local_d8._M_dataplus._M_p._0_4_);
      return true;
    }
    Reflection::SetInt32(this_00,message,field,(int32_t)local_d8._M_dataplus._M_p._0_4_);
    return true;
  case MAX_TYPE:
    bVar2 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)18>
                      (input,(int64_t *)&local_d8);
LAB_003b6968:
    if (bVar2 == false) {
      return false;
    }
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddInt64(this_00,message,field,(int64_t)local_d8._M_dataplus._M_p);
    }
    else {
      Reflection::SetInt64(this_00,message,field,(int64_t)local_d8._M_dataplus._M_p);
    }
  }
  return true;
}

Assistant:

bool WireFormat::ParseAndMergeField(
    uint32_t tag,
    const FieldDescriptor* field,  // May be nullptr for unknown
    Message* message, io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();

  enum { UNKNOWN, NORMAL_FORMAT, PACKED_FORMAT } value_format;

  if (field == nullptr) {
    value_format = UNKNOWN;
  } else if (WireFormatLite::GetTagWireType(tag) ==
             WireTypeForFieldType(field->type())) {
    value_format = NORMAL_FORMAT;
  } else if (field->is_packable() &&
             WireFormatLite::GetTagWireType(tag) ==
                 WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    value_format = PACKED_FORMAT;
  } else {
    // We don't recognize this field. Either the field number is unknown
    // or the wire type doesn't match. Put it in our unknown field set.
    value_format = UNKNOWN;
  }

  if (value_format == UNKNOWN) {
    return SkipField(input, tag,
                     message_reflection->MutableUnknownFields(message));
  } else if (value_format == PACKED_FORMAT) {
    uint32_t length;
    if (!input->ReadVarint32(&length)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(length);

    switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    while (input->BytesUntilLimit() > 0) {                                     \
      CPPTYPE value;                                                           \
      if (!WireFormatLite::ReadPrimitive<CPPTYPE,                              \
                                         WireFormatLite::TYPE_##TYPE>(input,   \
                                                                      &value)) \
        return false;                                                          \
      message_reflection->Add##CPPTYPE_METHOD(message, field, value);          \
    }                                                                          \
    break;                                                                     \
  }

      HANDLE_PACKED_TYPE(INT32, int32_t, Int32)
      HANDLE_PACKED_TYPE(INT64, int64_t, Int64)
      HANDLE_PACKED_TYPE(SINT32, int32_t, Int32)
      HANDLE_PACKED_TYPE(SINT64, int64_t, Int64)
      HANDLE_PACKED_TYPE(UINT32, uint32_t, UInt32)
      HANDLE_PACKED_TYPE(UINT64, uint64_t, UInt64)

      HANDLE_PACKED_TYPE(FIXED32, uint32_t, UInt32)
      HANDLE_PACKED_TYPE(FIXED64, uint64_t, UInt64)
      HANDLE_PACKED_TYPE(SFIXED32, int32_t, Int32)
      HANDLE_PACKED_TYPE(SFIXED64, int64_t, Int64)

      HANDLE_PACKED_TYPE(FLOAT, float, Float)
      HANDLE_PACKED_TYPE(DOUBLE, double, Double)

      HANDLE_PACKED_TYPE(BOOL, bool, Bool)
#undef HANDLE_PACKED_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value))
            return false;
          if (message->GetDescriptor()->file()->syntax() ==
              FileDescriptor::SYNTAX_PROTO3) {
            message_reflection->AddEnumValue(message, field, value);
          } else {
            const EnumValueDescriptor* enum_value =
                field->enum_type()->FindValueByNumber(value);
            if (enum_value != nullptr) {
              message_reflection->AddEnum(message, field, enum_value);
            } else {
              // The enum value is not one of the known values.  Add it to the
              // UnknownFieldSet.
              int64_t sign_extended_value = static_cast<int64_t>(value);
              message_reflection->MutableUnknownFields(message)->AddVarint(
                  WireFormatLite::GetTagFieldNumber(tag), sign_extended_value);
            }
          }
        }

        break;
      }

      case FieldDescriptor::TYPE_STRING:
      case FieldDescriptor::TYPE_GROUP:
      case FieldDescriptor::TYPE_MESSAGE:
      case FieldDescriptor::TYPE_BYTES:
        // Can't have packed fields of these types: these should be caught by
        // the protocol compiler.
        return false;
        break;
    }

    input->PopLimit(limit);
  } else {
    // Non-packed value (value_format == NORMAL_FORMAT)
    switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                            \
  case FieldDescriptor::TYPE_##TYPE: {                                        \
    CPPTYPE value;                                                            \
    if (!WireFormatLite::ReadPrimitive<CPPTYPE, WireFormatLite::TYPE_##TYPE>( \
            input, &value))                                                   \
      return false;                                                           \
    if (field->is_repeated()) {                                               \
      message_reflection->Add##CPPTYPE_METHOD(message, field, value);         \
    } else {                                                                  \
      message_reflection->Set##CPPTYPE_METHOD(message, field, value);         \
    }                                                                         \
    break;                                                                    \
  }

      HANDLE_TYPE(INT32, int32_t, Int32)
      HANDLE_TYPE(INT64, int64_t, Int64)
      HANDLE_TYPE(SINT32, int32_t, Int32)
      HANDLE_TYPE(SINT64, int64_t, Int64)
      HANDLE_TYPE(UINT32, uint32_t, UInt32)
      HANDLE_TYPE(UINT64, uint64_t, UInt64)

      HANDLE_TYPE(FIXED32, uint32_t, UInt32)
      HANDLE_TYPE(FIXED64, uint64_t, UInt64)
      HANDLE_TYPE(SFIXED32, int32_t, Int32)
      HANDLE_TYPE(SFIXED64, int64_t, Int64)

      HANDLE_TYPE(FLOAT, float, Float)
      HANDLE_TYPE(DOUBLE, double, Double)

      HANDLE_TYPE(BOOL, bool, Bool)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value))
          return false;
        if (field->is_repeated()) {
          message_reflection->AddEnumValue(message, field, value);
        } else {
          message_reflection->SetEnumValue(message, field, value);
        }
        break;
      }

      // Handle strings separately so that we can optimize the ctype=CORD case.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = StrictUtf8Check(field);
        std::string value;
        if (!WireFormatLite::ReadString(input, &value)) return false;
        if (strict_utf8_check) {
          if (!WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                                WireFormatLite::PARSE,
                                                field->full_name().c_str())) {
            return false;
          }
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), PARSE,
                                     field->full_name().c_str());
        }
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        std::string value;
        if (!WireFormatLite::ReadBytes(input, &value)) return false;
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadGroup(WireFormatLite::GetTagFieldNumber(tag),
                                       input, sub_message))
          return false;
        break;
      }

      case FieldDescriptor::TYPE_MESSAGE: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadMessage(input, sub_message)) return false;
        break;
      }
    }
  }

  return true;
}